

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O3

uint32_t __thiscall BoardIO::ReadIPv4Address(BoardIO *this)

{
  BasePort *pBVar1;
  ulong uVar2;
  uint32_t read_data;
  uint32_t local_c;
  
  pBVar1 = this->port;
  if (((pBVar1 == (BasePort *)0x0) || (uVar2 = (ulong)this->BoardId, 0xf < uVar2)) ||
     ((uint)pBVar1->FirmwareVersion[uVar2] < 7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO::ReadIPv4Address: requires firmware 7 or above",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    local_c = 0;
  }
  else {
    local_c = 0;
    (*pBVar1->_vptr_BasePort[0x23])(pBVar1,uVar2,0xb,&local_c);
  }
  return local_c;
}

Assistant:

uint32_t BoardIO::ReadIPv4Address(void) const
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "AmpIO::ReadIPv4Address: requires firmware 7 or above" << std::endl;
        return 0;
    }
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, BoardIO::IP_ADDR, read_data);
    return read_data;
}